

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O3

void Amap_ManCleanData(Amap_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = p->vObjs;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      if (pVVar1->pArray[lVar2] != (void *)0x0) {
        *(undefined8 *)((long)pVVar1->pArray[lVar2] + 0x28) = 0;
        pVVar1 = p->vObjs;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Amap_ManCleanData( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i;
//    Amap_ManForEachNode( p, pObj, i )
//        ABC_FREE( pObj->pData );
    Amap_ManForEachObj( p, pObj, i )
        pObj->pData = NULL;
}